

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void contains_bulk(void)

{
  _Bool _Var1;
  _Bool _Var2;
  roaring_bitmap_t *r;
  uint32_t uVar3;
  long lVar4;
  roaring_bulk_context_t context;
  roaring_bulk_context_t empty_context;
  roaring_bulk_context_t local_58;
  roaring_bulk_context_t local_48;
  
  r = roaring_bitmap_create_with_capacity(0);
  local_58.container = (void *)0x0;
  local_58.idx = 0;
  local_58.key = 0;
  local_58.typecode = '\0';
  local_58._15_1_ = 0;
  _Var1 = roaring_bitmap_contains_bulk(r,&local_58,0);
  _assert_true((ulong)!_Var1,"!roaring_bitmap_contains_bulk(bm, &context, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x9d);
  _Var1 = roaring_bitmap_contains_bulk(r,&local_58,0xffffffff);
  _assert_true((ulong)!_Var1,"!roaring_bitmap_contains_bulk(bm, &context, 0xFFFFFFFF)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x9e);
  roaring_bitmap_add_range_closed(r,0,1000);
  uVar3 = 0x12cc6;
  do {
    uVar3 = uVar3 + 2;
    roaring_bitmap_add(r,uVar3);
  } while (uVar3 < 0x153d6);
  uVar3 = 0x2039e;
  do {
    uVar3 = uVar3 + 2;
    roaring_bitmap_add(r,uVar3);
  } while (uVar3 < 0x222de);
  roaring_bitmap_add(r,0xffffffff);
  lVar4 = 0;
  do {
    local_48.container = (void *)0x0;
    local_48.idx = 0;
    local_48.key = 0;
    local_48.typecode = '\0';
    local_48._15_1_ = 0;
    uVar3 = *(uint32_t *)((long)&DAT_00135310 + lVar4);
    _Var1 = roaring_bitmap_contains(r,uVar3);
    _Var2 = roaring_bitmap_contains_bulk(r,&local_48,uVar3);
    _assert_true((ulong)(_Var2 == _Var1),
                 "expected_contains == roaring_bitmap_contains_bulk( bm, &empty_context, values[i])"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0xc2);
    _Var2 = roaring_bitmap_contains_bulk(r,&local_58,uVar3);
    _assert_true((ulong)(_Var2 == _Var1),
                 "expected_contains == roaring_bitmap_contains_bulk(bm, &context, values[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0xc4);
    if (_Var1) {
      _assert_int_equal((ulong)local_58._8_8_ >> 0x20 & 0xffff,(ulong)(uVar3 >> 0x10),
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                        ,199);
    }
    if (local_58.container != (void *)0x0) {
      _assert_in_range((long)local_58.idx,0,(long)(r->high_low_container).size - 1,
                       "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                       ,0xca);
      _assert_int_equal((unsigned_long)local_58.container,
                        (unsigned_long)(r->high_low_container).containers[local_58.idx],
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                        ,0xcc);
      _assert_int_equal((ulong)local_58._8_8_ >> 0x20 & 0xffff,
                        (ulong)(r->high_low_container).keys[local_58.idx],
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                        ,0xce);
      _assert_int_equal((ulong)local_58._8_8_ >> 0x30 & 0xff,
                        (ulong)(r->high_low_container).typecodes[local_58.idx],
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                        ,0xd0);
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x30);
  roaring_bitmap_free(r);
  return;
}

Assistant:

bool roaring_iterator_sumall(uint32_t value, void *param) {
    *(uint32_t *)param += value;
    return true;  // continue till the end
}